

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::ShiftExp(SQParser *this)

{
  long lVar1;
  Expr *pEVar2;
  Expr *lhs;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  pEVar2 = PlusExp(this);
  do {
    NestingChecker::inc(&nc);
    lVar1 = this->_token;
    if (lVar1 == 0x128) {
      lhs = (Expr *)0x25;
    }
    else if (lVar1 == 0x129) {
      lhs = (Expr *)0x24;
    }
    else {
      lhs = (Expr *)0x23;
      if (lVar1 != 0x132) {
        (nc._p)->_depth = (nc._p)->_depth - nc._depth;
        return pEVar2;
      }
    }
    pEVar2 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>(this,0x154c28,TO_BLOCK,lhs)
    ;
  } while( true );
}

Assistant:

Expr* SQParser::ShiftExp()
{
    NestingChecker nc(this);
    Expr *lhs = PlusExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_USHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_USHR, lhs); break;
        case TK_SHIFTL: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHL, lhs); break;
        case TK_SHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHR, lhs); break;
        default: return lhs;
        }
    }
}